

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

char * singleOptionDefaultValue(size_t lineLength,poptOption *opt,char *translation_domain)

{
  float *pfVar1;
  char *__src;
  int iVar2;
  char *pcVar3;
  size_t __n;
  size_t sVar4;
  size_t slen;
  size_t limit;
  char *s;
  double aDouble;
  poptArg arg;
  char *l;
  char *le;
  char *defstr;
  char *translation_domain_local;
  poptOption *opt_local;
  size_t lineLength_local;
  
  lineLength_local = (size_t)malloc(lineLength * 4 + 1);
  if ((undefined1 *)lineLength_local == (undefined1 *)0x0) {
    lineLength_local = 0;
  }
  else {
    *(undefined1 *)lineLength_local = 0;
    *(undefined1 *)lineLength_local = 0x28;
    pcVar3 = stpcpy((char *)(lineLength_local + 1),"default");
    *pcVar3 = ':';
    l = pcVar3 + 2;
    pcVar3[1] = ' ';
    if (opt->arg != (void *)0x0) {
      pfVar1 = (float *)opt->arg;
      switch(opt->argInfo & _poptArgMask) {
      case 0:
      default:
        _free((void *)lineLength_local);
        return (char *)0x0;
      case 1:
        __src = *(char **)pfVar1;
        if (__src == (char *)0x0) {
          l = stpcpy(l,"null");
        }
        else {
          __n = (lineLength * 4 - ((long)l - lineLength_local)) - 4;
          pcVar3 = pcVar3 + 3;
          *l = '\"';
          strncpy(pcVar3,__src,__n);
          pcVar3[__n] = '\0';
          sVar4 = strlen(pcVar3);
          pcVar3 = pcVar3 + sVar4;
          if ((sVar4 == __n) && (__src[__n] != '\0')) {
            pcVar3[-3] = '.';
            pcVar3[-2] = '.';
            pcVar3[-1] = '.';
          }
          l = pcVar3 + 1;
          *pcVar3 = '\"';
        }
        break;
      case 2:
      case 7:
        iVar2 = sprintf(l,"%d",(ulong)(uint)*pfVar1);
        l = l + iVar2;
        break;
      case 3:
        iVar2 = sprintf(l,"%ld",*(undefined8 *)pfVar1);
        l = l + iVar2;
        break;
      case 8:
        iVar2 = sprintf(l,"%g",(double)*pfVar1);
        l = l + iVar2;
        break;
      case 9:
        iVar2 = sprintf(l,"%g",*(undefined8 *)pfVar1);
        l = l + iVar2;
        break;
      case 10:
        iVar2 = sprintf(l,"%lld",*(undefined8 *)pfVar1);
        l = l + iVar2;
        break;
      case 0xc:
        iVar2 = sprintf(l,"%p",opt->arg);
        l = l + iVar2;
        break;
      case 0xd:
        iVar2 = sprintf(l,"%hd",(ulong)(uint)(int)*(short *)pfVar1);
        l = l + iVar2;
        break;
      case 0x1b:
        iVar2 = sprintf(l,"%p",opt->arg);
        l = l + iVar2;
      }
    }
    *l = ')';
    l[1] = '\0';
  }
  return (char *)lineLength_local;
}

Assistant:

static char *
singleOptionDefaultValue(size_t lineLength,
		const struct poptOption * opt,
		/* FIX: i18n macros disabled with lclint */
		const char * translation_domain)
{
    const char * defstr = D_(translation_domain, "default");
    char * le = malloc(4*lineLength + 1);
    char * l = le;

    if (le == NULL) return NULL;	/* XXX can't happen */
    *le = '\0';
    *le++ = '(';
    le = stpcpy(le, defstr);
    *le++ = ':';
    *le++ = ' ';
  if (opt->arg) {	/* XXX programmer error */
    poptArg arg = { .ptr = opt->arg };
    switch (poptArgType(opt)) {
    case POPT_ARG_VAL:
    case POPT_ARG_INT:
	le += sprintf(le, "%d", arg.intp[0]);
	break;
    case POPT_ARG_SHORT:
	le += sprintf(le, "%hd", arg.shortp[0]);
	break;
    case POPT_ARG_LONG:
	le += sprintf(le, "%ld", arg.longp[0]);
	break;
    case POPT_ARG_LONGLONG:
	le += sprintf(le, "%lld", arg.longlongp[0]);
	break;
    case POPT_ARG_FLOAT:
    {	double aDouble = (double) arg.floatp[0];
	le += sprintf(le, "%g", aDouble);
    }	break;
    case POPT_ARG_DOUBLE:
	le += sprintf(le, "%g", arg.doublep[0]);
	break;
    case POPT_ARG_MAINCALL:
	le += sprintf(le, "%p", opt->arg);
	break;
    case POPT_ARG_ARGV:
	le += sprintf(le, "%p", opt->arg);
	break;
    case POPT_ARG_STRING:
    {	const char * s = arg.argv[0];
	if (s == NULL)
	    le = stpcpy(le, "null");
	else {
	    size_t limit = 4*lineLength - (le - l) - sizeof("\"\")");
	    size_t slen;
	    *le++ = '"';
	    strncpy(le, s, limit); le[limit] = '\0'; le += (slen = strlen(le));
	    if (slen == limit && s[limit])
		le[-1] = le[-2] = le[-3] = '.';
	    *le++ = '"';
	}
    }	break;
    case POPT_ARG_NONE:
    default:
	l = _free(l);
	return NULL;
	break;
    }
  }
    *le++ = ')';
    *le = '\0';

    return l;
}